

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  uint32_t uVar5;
  cTValue *in_RDX;
  lua_State *in_RSI;
  long in_RDI;
  Node *nn;
  Node *freenode;
  Node *collide;
  Node *nodebase;
  Node *n;
  Node *n_1;
  GCobj *o;
  TValue *local_70;
  TValue *local_68;
  
  pTVar2 = &hashkey((GCtab *)in_RSI,in_RDX)->val;
  if (((pTVar2->field_2).it != 0xffffffff) || (*(uint32_t *)((long)&in_RSI->top + 4) == 0)) {
    pTVar3 = (TValue *)(ulong)((MRef *)((GCRef *)&in_RSI->base + 1))->ptr32;
    pTVar4 = (TValue *)(ulong)((MRef *)((long)pTVar3 + 0x14))->ptr32;
    do {
      local_70 = pTVar4;
      if (local_70 == pTVar3) {
        rehashtab((lua_State *)t,(GCtab *)&key->field_2,&n->val);
        pTVar2 = lj_tab_set(in_RSI,(GCtab *)&in_RDX->field_2,pTVar2);
        return pTVar2;
      }
      pTVar4 = local_70 + -3;
    } while (*(int *)((long)local_70 + -0xc) != -1);
    uVar5 = (uint32_t)pTVar4;
    ((MRef *)((long)pTVar3 + 0x14))->ptr32 = uVar5;
    local_68 = &hashkey((GCtab *)in_RSI,pTVar2 + 1)->val;
    if (local_68 == pTVar2) {
      local_70[-1].field_2.field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = uVar5;
      pTVar2 = pTVar4;
    }
    else {
      while ((TValue *)(ulong)local_68[2].u32.lo != pTVar2) {
        local_68 = (TValue *)(ulong)local_68[2].u32.lo;
      }
      local_68[2].u32.lo = uVar5;
      pTVar4->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar2;
      local_70[-2] = pTVar2[1];
      local_70[-1].field_2.field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = 0;
      (pTVar2->field_2).it = 0xffffffff;
      while (local_70 = pTVar4, local_70[2].u32.lo != 0) {
        uVar1 = local_70[2].u32.lo;
        pTVar4 = (TValue *)(ulong)uVar1;
        if (((*(int *)((long)pTVar4 + 0xc) == -5) && ((pTVar4->field_2).it != 0xffffffff)) &&
           ((TValue *)
            ((ulong)((MRef *)((GCRef *)&in_RSI->base + 1))->ptr32 +
            (ulong)(*(uint *)((ulong)pTVar4[1].u32.lo + 8) & *(uint32_t *)((long)&in_RSI->top + 4))
            * 0x18) == pTVar2)) {
          local_70[2].field_2.field_0 = pTVar4[2].field_2.field_0;
          pTVar4[2].field_2.field_0 = pTVar2[2].field_2.field_0;
          pTVar2[2].u32.lo = uVar1;
          pTVar4 = local_70;
        }
      }
    }
  }
  pTVar2[1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)*in_RDX;
  if (pTVar2[1].u64 == 0x8000000000000000) {
    pTVar2[1].u64 = 0;
  }
  if ((in_RSI->marked & 4) != 0) {
    uVar1 = *(uint *)(in_RDI + 8);
    in_RSI->marked = in_RSI->marked & 0xfb;
    (in_RSI->gclist).gcptr32 = *(uint32_t *)((ulong)uVar1 + 0x3c);
    *(int *)((ulong)uVar1 + 0x3c) = (int)in_RSI;
  }
  return pTVar2;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = noderef(nodebase->freetop);
    lua_assert(freenode >= nodebase && freenode <= nodebase+t->hmask+1);
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setmref(nodebase->freetop, freenode);
    lua_assert(freenode != &G(L)->nilnode);
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (tvisstr(&nn->key) && !tvisnil(&nn->val) &&
	    hashstr(t, strV(&nn->key)) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lua_assert(tvisnil(&n->val));
  return &n->val;
}